

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void check_analyze(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long in_RSI;
  long in_RDI;
  int skill;
  int intel;
  int in_stack_0000001c;
  CHAR_DATA *in_stack_00000020;
  int in_stack_000000c4;
  bool in_stack_000000cb;
  int in_stack_000000cc;
  CHAR_DATA *in_stack_000000d0;
  int in_stack_000000ec;
  CHAR_DATA *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  bVar1 = is_npc((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if (((!bVar1) && (bVar1 = style_check((int)in_RSI,in_stack_ffffffffffffffec), bVar1)) &&
     (iVar2 = get_skill(in_stack_000000f0,in_stack_000000ec), iVar2 != 0)) {
    iVar3 = get_curr_stat(in_stack_00000020,in_stack_0000001c);
    iVar4 = number_percent();
    if (iVar4 <= iVar2 + -0x7d + iVar3 * 5) {
      if (in_RSI != *(long *)(in_RDI + 0x310)) {
        *(undefined4 *)(in_RDI + 0x318) = 0;
      }
      *(undefined8 *)(in_RDI + 0x310) = *(undefined8 *)(in_RDI + 0x20);
      bVar1 = is_npc((CHAR_DATA *)CONCAT44(iVar3,iVar2));
      if ((!bVar1) || (iVar2 = number_percent(), iVar2 < 0x29)) {
        if (*(int *)(in_RDI + 0x318) < 0x32) {
          *(int *)(in_RDI + 0x318) = *(int *)(in_RDI + 0x318) + 1;
        }
        check_improve(in_stack_000000d0,in_stack_000000cc,in_stack_000000cb,in_stack_000000c4);
      }
    }
  }
  return;
}

Assistant:

void check_analyze(CHAR_DATA *ch, CHAR_DATA *victim)
{
	int intel, skill;
	if (is_npc(ch))
	{
	/*
		skill = 30 + ch->level;
		if (number_percent () > (skill - 125 + (5 * get_curr_stat(ch,STAT_INT))))
			return;

		if (victim != ch->analyzePC)
			ch->analyze = 0;

		ch->analyzePC = ch->fighting;
		if (ch->analyze < 50)
			ch->analyze++;
	*/
		return;
	}

	if (!style_check(gsn_analyze, ch->pcdata->style))
		return;

	skill = get_skill(ch, gsn_analyze);

	if (skill == 0)
		return;

	intel = get_curr_stat(ch, STAT_INT);

	if (number_percent() > (skill - 125 + (5 * intel)))
		return;

	if (victim != ch->analyzePC)
		ch->analyze = 0;

	ch->analyzePC = ch->fighting;

	if (is_npc(victim))
	{
		if (number_percent() > 40)
			return;
	}

	if (ch->analyze < 50)
		ch->analyze++;

	check_improve(ch, gsn_analyze, true, 6);
}